

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::buffer<wchar_t>::append<wchar_t>(buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  size_t sVar1;
  type tVar2;
  ulong uVar3;
  
  sVar1 = this->size_;
  tVar2 = to_unsigned<long>((long)end - (long)begin >> 2);
  uVar3 = tVar2 + sVar1;
  if (this->capacity_ < uVar3) {
    (**this->_vptr_buffer)(this,uVar3);
  }
  if (end != begin) {
    memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
  }
  this->size_ = uVar3;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end, make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}